

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall
ON_NurbsSurface::ConvertSpanToBezier
          (ON_NurbsSurface *this,int span_index0,int span_index1,ON_BezierSurface *bezier_surface)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  int iVar9;
  bool bVar10;
  ON_NurbsSurface bispan;
  ON_NurbsSurface local_88;
  
  if ((this->m_cv != (double *)0x0) && (pdVar8 = this->m_knot[0], pdVar8 != (double *)0x0)) {
    pdVar7 = this->m_knot[1];
    if (-1 < span_index0 && pdVar7 != (double *)0x0) {
      if (span_index1 < 0) {
        return false;
      }
      if (this->m_cv_count[0] - this->m_order[0] < span_index0) {
        return false;
      }
      if (((span_index1 <= this->m_cv_count[1] - this->m_order[1]) &&
          (lVar6 = (long)(this->m_order[0] + span_index0), pdVar8[lVar6 + -2] < pdVar8[lVar6 + -1]))
         && (lVar6 = (long)(this->m_order[1] + span_index1), pdVar7[lVar6 + -2] < pdVar7[lVar6 + -1]
            )) {
        ON_NurbsSurface(&local_88);
        local_88.m_cv = bezier_surface->m_cv;
        local_88.m_cv_capacity = bezier_surface->m_cv_capacity;
        Create(&local_88,this->m_dim,this->m_is_rat != 0,this->m_order[0],this->m_order[1],
               this->m_order[0],this->m_order[1]);
        iVar9 = this->m_order[0];
        iVar3 = this->m_order[1];
        if (0 < iVar9) {
          iVar1 = this->m_dim;
          iVar2 = this->m_is_rat;
          iVar5 = 0;
          do {
            if (0 < iVar3) {
              iVar9 = 0;
              do {
                uVar4 = local_88.m_cv_stride[1] * iVar9 + local_88.m_cv_stride[0] * iVar5;
                pdVar8 = local_88.m_cv + uVar4;
                if ((int)uVar4 < 0) {
                  pdVar8 = (double *)0x0;
                }
                if (local_88.m_cv == (double *)0x0) {
                  pdVar8 = (double *)0x0;
                }
                uVar4 = (span_index1 + iVar9) * this->m_cv_stride[1] +
                        this->m_cv_stride[0] * (iVar5 + span_index0);
                pdVar7 = this->m_cv + uVar4;
                if ((int)uVar4 < 0) {
                  pdVar7 = (double *)0x0;
                }
                if (this->m_cv == (double *)0x0) {
                  pdVar7 = (double *)0x0;
                }
                memcpy(pdVar8,pdVar7,(long)(int)(((iVar1 + 1) - (uint)(iVar2 == 0)) * 8));
                iVar9 = iVar9 + 1;
                iVar3 = this->m_order[1];
              } while (iVar9 < iVar3);
              iVar9 = this->m_order[0];
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < iVar9);
        }
        pdVar8 = this->m_knot[0];
        pdVar7 = this->m_knot[1];
        if ((pdVar7[(uint)span_index1] != pdVar7[(long)(iVar3 + span_index1) + -2]) ||
           (NAN(pdVar7[(uint)span_index1]) || NAN(pdVar7[(long)(iVar3 + span_index1) + -2]))) {
          bVar10 = true;
        }
        else {
          bVar10 = pdVar8[(long)(iVar9 + span_index0) + -2] != pdVar8[(uint)span_index0] ||
                   pdVar8[(long)(iVar9 + span_index0) + -1] !=
                   pdVar8[(long)(span_index0 + iVar9 * 2) + -3];
        }
        if (((pdVar7[(long)(iVar3 + span_index1) + -1] !=
              pdVar7[(long)(span_index1 + iVar3 * 2) + -3]) ||
            (NAN(pdVar7[(long)(iVar3 + span_index1) + -1]) ||
             NAN(pdVar7[(long)(span_index1 + iVar3 * 2) + -3]))) || (bVar10)) {
          iVar9 = ON_KnotCount(local_88.m_order[0],local_88.m_cv_count[0]);
          memcpy(local_88.m_knot[0],pdVar8 + (uint)span_index0,(long)iVar9 << 3);
          pdVar8 = this->m_knot[1];
          iVar9 = ON_KnotCount(local_88.m_order[1],local_88.m_cv_count[1]);
          memcpy(local_88.m_knot[1],pdVar8 + (uint)span_index1,(long)iVar9 << 3);
          ClampEnd(&local_88,1,2);
          ClampEnd(&local_88,0,2);
        }
        bezier_surface->m_dim = local_88.m_dim;
        bezier_surface->m_is_rat = local_88.m_is_rat;
        *(ulong *)bezier_surface->m_order = CONCAT44(local_88.m_order[1],local_88.m_order[0]);
        *(ulong *)bezier_surface->m_cv_stride =
             CONCAT44(local_88.m_cv_stride[1],local_88.m_cv_stride[0]);
        bezier_surface->m_cv = local_88.m_cv;
        bezier_surface->m_cv_capacity = local_88.m_cv_capacity;
        local_88.m_cv = (double *)0x0;
        local_88.m_cv_capacity = 0;
        ~ON_NurbsSurface(&local_88);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_NurbsSurface::ConvertSpanToBezier(
    int span_index0,
    int span_index1, 
    ON_BezierSurface& bezier_surface
    ) const
{
  int i, j;
  if ( !m_cv || !m_knot[0] || !m_knot[1] )
    return false;
  if ( span_index0 < 0 ||  span_index0 > m_cv_count[0]-m_order[0] )
    return false;
  if ( span_index1 < 0 ||  span_index1 > m_cv_count[1]-m_order[1] )
    return false;
  i = span_index0+m_order[0]-2;
  if ( m_knot[0][i] >= m_knot[0][i+1] )
    return false;
  j = span_index1+m_order[1]-2;
  if ( m_knot[1][j] >= m_knot[1][j+1] )
    return false;
  {
    ON_NurbsSurface bispan;
    bispan.m_cv = bezier_surface.m_cv;
    bispan.m_cv_capacity = bezier_surface.m_cv_capacity;
    bispan.Create( m_dim, m_is_rat, m_order[0], m_order[1], m_order[0], m_order[1] );
    const int sizeof_cv = CVSize()*sizeof(*bispan.m_cv);
    for ( i = 0; i < m_order[0]; i++ ) for ( j = 0; j < m_order[1]; j++ )
    {
      memcpy( bispan.CV(i,j), CV(span_index0+i,span_index1+j), sizeof_cv ); 
    }
    i = span_index0+m_order[0]-2;
    j = span_index1+m_order[1]-2;
    bool bClamp = false;
    if ( m_knot[0][span_index0] != m_knot[0][span_index0+m_order[0]-2] )
      bClamp = true;
    if ( m_knot[0][span_index0+m_order[0]-1] != m_knot[0][span_index0+2*m_order[0]-3] )
      bClamp = true;
    if ( m_knot[1][span_index1] != m_knot[1][span_index1+m_order[1]-2] )
      bClamp = true;
    if ( m_knot[1][span_index1+m_order[1]-1] != m_knot[1][span_index1+2*m_order[1]-3] )
      bClamp = true;
    if ( bClamp )
    {
      memcpy( bispan.m_knot[0], m_knot[0]+span_index0, bispan.KnotCount(0)*sizeof(bispan.m_knot[0][0]) );
      memcpy( bispan.m_knot[1], m_knot[1]+span_index1, bispan.KnotCount(1)*sizeof(bispan.m_knot[1][0]) );
      bispan.ClampEnd(1,2);
      bispan.ClampEnd(0,2);
    }
    bezier_surface.m_dim = bispan.m_dim;
    bezier_surface.m_is_rat = bispan.m_is_rat;
    bezier_surface.m_order[0] = bispan.m_order[0];
    bezier_surface.m_order[1] = bispan.m_order[1];
    bezier_surface.m_cv_stride[0] = bispan.m_cv_stride[0];
    bezier_surface.m_cv_stride[1] = bispan.m_cv_stride[1];
    bezier_surface.m_cv = bispan.m_cv;
    bezier_surface.m_cv_capacity = bispan.m_cv_capacity;
    bispan.m_cv = 0;
    bispan.m_cv_capacity = 0;
  }
  return true;
}